

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

void process(void)

{
  bool bVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ushort uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint16_t uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aVar14;
  bool bVar15;
  uint16_t color_00;
  uint16_t uVar16;
  unsigned_short uVar17;
  ComparisonResult CVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  undefined8 uVar22;
  pointer pPVar23;
  const_iterator pvVar24;
  const_iterator pvVar25;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>,_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
  pbVar26;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  int *piVar27;
  undefined1 uVar28;
  char cVar29;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  optional<File> *file;
  optional<File> *file_00;
  optional<File> *file_01;
  short sVar35;
  ProtoPalette *protoPal;
  png_byte *ppVar36;
  Palette *pPVar37;
  uint uVar38;
  unsigned_long uVar39;
  long *plVar40;
  pointer pAVar41;
  uint uVar42;
  char *pcVar43;
  uint32_t y;
  int iVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  uint32_t y_1;
  uint32_t y_00;
  array<unsigned_short,_4UL> aVar48;
  long *plVar49;
  uint32_t x;
  int iVar50;
  ProtoPalette *pPVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  int iVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar69;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar70;
  int iVar72;
  undefined1 auVar71 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar75 [16];
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> protoPalettes;
  ProtoPalette tileColors;
  Rgba color;
  Png png;
  _Alloc_hider _Stack_28528;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> vStack_28508;
  undefined1 auStack_284e8 [16];
  AttrmapEntry *pAStack_284d8;
  Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
  VStack_284c8;
  long lStack_284c0;
  ulong uStack_284b8;
  tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
  tStack_284b0;
  undefined1 auStack_28480 [8];
  vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  avStack_28478 [9];
  __index_type _Stack_28390;
  char cStack_28388;
  undefined1 auStack_28380 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_28370 [2];
  undefined1 auStack_28350 [200];
  char cStack_28288;
  _Variadic_union<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  _Stack_28280;
  char cStack_28188;
  Png PStack_28180;
  
  uVar32 = 0;
  uVar22 = png_get_libpng_ver(0);
  Options::verbosePrint(&options,'\x01',"Using libpng %s\n",uVar22);
  Options::verbosePrint(&options,'\x02',"Reading tiles...\n");
  Png::Png(&PStack_28180,(path *)&options.input);
  if (2 < options.verbosity) {
    process();
  }
  vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
  super__Vector_impl_data._M_start = (ProtoPalette *)0x0;
  vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
  super__Vector_impl_data._M_finish = (ProtoPalette *)0x0;
  vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (ProtoPalette *)0x0;
  pAStack_284d8 = (AttrmapEntry *)0x0;
  auStack_284e8 = (undefined1  [16])0x0;
  uVar30 = PStack_28180.width;
  if (options.inputSlice.width != 0) {
    uVar30 = (uint)options.inputSlice.width << 3;
  }
  lStack_284c0 = CONCAT71(lStack_284c0._1_7_,options.columnMajor);
  uVar33 = PStack_28180.height;
  if (options.inputSlice.height != 0) {
    uVar33 = (uint)options.inputSlice.height << 3;
  }
  uVar42 = uVar33;
  if (options.columnMajor != false) {
    uVar42 = 0;
    uVar32 = (ulong)uVar30;
  }
  if ((int)uVar32 == 0 && uVar42 == 0) {
    pcVar43 = "s";
    lVar31 = 0;
  }
  else {
    uVar21 = 0;
    uVar19 = 0;
    uStack_284b8 = uVar32;
    do {
      uVar13 = options.inputSlice.top;
      uVar16 = options.inputSlice.left;
      auStack_28480._0_2_ = 0xffff;
      auStack_28480._2_2_ = 0xffff;
      auStack_28480._4_2_ = 0xffff;
      auStack_28480._6_2_ = 0xffff;
      if ((AttrmapEntry *)auStack_284e8._8_8_ == pAStack_284d8) {
        std::
        vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>::
        _M_realloc_insert<>((vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
                             *)auStack_284e8,(iterator)auStack_284e8._8_8_);
        _Stack_28528._M_p = (pointer)auStack_284e8._8_8_;
      }
      else {
        _Stack_28528._M_p = (pointer)(auStack_284e8._8_8_ + 0x10);
        auStack_284e8._8_8_ = _Stack_28528._M_p;
      }
      bVar46 = 0;
      iVar44 = 0;
      uVar38 = uVar13 + uVar19;
      do {
        iVar50 = 0;
        do {
          auStack_28380._0_4_ =
               PStack_28180.pixels.
               super__Vector_base<Rgba,_default_init_allocator<Rgba,_std::allocator<Rgba>_>_>.
               _M_impl.super__Vector_impl_data._M_start
               [PStack_28180.width * uVar38 + uVar16 + uVar21 + iVar50];
          if (0xfffffff <
              (uint)PStack_28180.pixels.
                    super__Vector_base<Rgba,_default_init_allocator<Rgba,_std::allocator<Rgba>_>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [PStack_28180.width * uVar38 + uVar16 + uVar21 + iVar50]) {
            color_00 = Rgba::cgbColor((Rgba *)auStack_28380);
            bVar15 = ProtoPalette::add((ProtoPalette *)auStack_28480,color_00);
            bVar46 = bVar46 + bVar15;
          }
          iVar50 = iVar50 + 1;
        } while (iVar50 != 8);
        iVar44 = iVar44 + 1;
        uVar38 = uVar38 + 1;
      } while (iVar44 != 8);
      bVar15 = ProtoPalette::empty((ProtoPalette *)auStack_28480);
      uVar32 = uStack_284b8;
      if (bVar15) {
        ((AttrmapEntry *)((long)_Stack_28528._M_p + -0x10))->protoPaletteID = 0xffffffffffffffff;
      }
      else {
        pPVar23 = vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar31 = 0;
          uVar34 = 0;
          do {
            CVar18 = ProtoPalette::compare
                               ((ProtoPalette *)auStack_28480,
                                (ProtoPalette *)
                                ((long)((vStack_28508.
                                         super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_colorIndices).
                                       _M_elems + lVar31));
            if (CVar18 == THEY_BIGGER) {
LAB_0010e502:
              ((AttrmapEntry *)((long)_Stack_28528._M_p + -0x10))->protoPaletteID = uVar34;
              goto LAB_0010e515;
            }
            if (CVar18 == WE_BIGGER) {
              *(undefined1 (*) [8])
               vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
               super__Vector_impl_data._M_start[uVar34]._colorIndices._M_elems = auStack_28480;
              goto LAB_0010e502;
            }
            uVar34 = uVar34 + 1;
            lVar31 = lVar31 + 8;
            pPVar23 = vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar34 < (ulong)((long)vStack_28508.
                                          super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)vStack_28508.
                                          super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        if ((byte)(options.nbColorsPerPal - options.hasTransparentPixels) < bVar46) {
          fatal("Tile at (%u, %u) has %zu opaque colors, more than %u!",(ulong)(uVar16 + uVar21),
                (ulong)(uVar13 + uVar19),(ulong)bVar46,
                (ulong)(byte)(options.nbColorsPerPal - options.hasTransparentPixels));
        }
        ((AttrmapEntry *)((long)_Stack_28528._M_p + -0x10))->protoPaletteID =
             (long)vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pPVar23 >> 3;
        if ((long)vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pPVar23 == -8) {
          fatal("Reached %zu proto-palettes... sorry, this image is too much for me to handle :(",
                0xffffffffffffffff);
        }
        if (vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<ProtoPalette,std::allocator<ProtoPalette>>::
          _M_realloc_insert<ProtoPalette_const&>
                    ((vector<ProtoPalette,std::allocator<ProtoPalette>> *)&vStack_28508,
                     (iterator)
                     vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(ProtoPalette *)auStack_28480);
        }
        else {
          *(undefined1 (*) [8])
           ((vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
             super__Vector_impl_data._M_finish)->_colorIndices)._M_elems = auStack_28480;
          vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
LAB_0010e515:
      uVar38 = uVar21;
      if ((char)lStack_284c0 != '\0') {
        uVar38 = uVar19;
      }
      uVar38 = uVar38 + 8;
      if ((char)lStack_284c0 == '\0') {
        uVar21 = uVar38;
        if (uVar38 == uVar30) {
          uVar19 = uVar19 + 8;
          uVar21 = 0;
        }
      }
      else {
        uVar19 = uVar38;
        if (uVar38 == uVar33) {
          uVar19 = 0;
          uVar21 = uVar21 + 8;
        }
      }
    } while ((uVar21 != (uint)uVar32) || (uVar19 != uVar42));
    lVar31 = (long)vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    pcVar43 = "s";
    if ((long)vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      pcVar43 = "";
    }
  }
  Options::verbosePrint(&options,'\x03',"Image contains %zu proto-palette%s\n",lVar31,pcVar43);
  pPVar23 = vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pPVar51 = vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (2 < options.verbosity) {
    for (; pPVar51 != pPVar23; pPVar51 = pPVar51 + 1) {
      fputs("[ ",_stderr);
      pvVar24 = ProtoPalette::begin(pPVar51);
      pvVar25 = ProtoPalette::end(pPVar51);
      for (; pvVar24 != pvVar25; pvVar24 = pvVar24 + 1) {
        fprintf(_stderr,"$%04x, ",(ulong)*pvVar24);
      }
      fputs("]\n",_stderr);
    }
  }
  if (options.palSpecType == EMBEDDED) {
    if (PStack_28180.embeddedPal == (png_color *)0x0) {
      fatal("`-c embedded` was given, but the PNG does not have an embedded palette!");
    }
    if (options.palSpec.
        super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        options.palSpec.
        super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
      _M_realloc_insert<>(&options.palSpec,
                          (iterator)
                          options.palSpec.
                          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
    }
    else {
      (options.palSpec.
       super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
       super__Vector_impl_data._M_finish)->_M_elems[0].red = (undefined1  [16])0x0;
      options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           options.palSpec.
           super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if ((long)options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0x10) {
      __assert_fail("options.palSpec.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                    ,0x209,"generatePalSpec");
    }
    uVar30 = (uint)(byte)(options.nbColorsPerPal - options.hasTransparentPixels);
    if (PStack_28180.nbColors <
        (int)(uint)(byte)(options.nbColorsPerPal - options.hasTransparentPixels)) {
      uVar30 = PStack_28180.nbColors;
    }
    if (0 < (int)uVar30) {
      ppVar36 = &(PStack_28180.embeddedPal)->blue;
      uVar32 = 0;
      do {
        if (PStack_28180.transparencyPal == (png_byte *)0x0) {
          uVar33 = 0xff000000;
        }
        else {
          uVar33 = (uint)PStack_28180.transparencyPal[uVar32] << 0x18;
        }
        uVar7._0_1_ = ((png_color *)(ppVar36 + -2))->red;
        uVar7._1_1_ = ((png_color *)(ppVar36 + -2))->green;
        (options.palSpec.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_start)->_M_elems[uVar32] =
             (Rgba)((uint)uVar7 | (uint)*ppVar36 << 0x10 | uVar33);
        uVar32 = uVar32 + 1;
        ppVar36 = ppVar36 + 3;
      } while (uVar30 != uVar32);
    }
  }
  if (options.palSpecType == NO_SPEC) {
    packing::overloadAndRemove
              ((tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                *)auStack_28480,&vStack_28508);
    if ((long)avStack_28478[0].
              super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)avStack_28478[0].
              super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
        (long)vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
              super__Vector_impl_data._M_start) {
      __assert_fail("mappings.size() == protoPalettes.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                    ,0x218,"generatePalettes");
    }
    if (2 < options.verbosity) {
      process();
    }
    std::vector<Palette,_std::allocator<Palette>_>::vector
              ((vector<Palette,_std::allocator<Palette>_> *)auStack_28380,(size_type)auStack_28480,
               (allocator_type *)&_Stack_28280._M_first);
    auVar12 = _DAT_001172c0;
    auVar11 = _DAT_001172b0;
    auVar10 = _DAT_001172a0;
    auVar9 = _DAT_00117290;
    auVar8 = _DAT_00117280;
    if ((options.hasTransparentPixels == true) && (auStack_28380._0_8_ != auStack_28380._8_8_)) {
      uVar32 = (auStack_28380._8_8_ - auStack_28380._0_8_) - 8;
      auVar56._8_4_ = (int)uVar32;
      auVar56._0_8_ = uVar32;
      auVar56._12_4_ = (int)(uVar32 >> 0x20);
      auVar53._0_8_ = uVar32 >> 3;
      auVar53._8_8_ = auVar56._8_8_ >> 3;
      uVar34 = 0;
      auVar53 = auVar53 ^ _DAT_001172c0;
      do {
        auVar64._8_4_ = (int)uVar34;
        auVar64._0_8_ = uVar34;
        auVar64._12_4_ = (int)(uVar34 >> 0x20);
        auVar56 = (auVar64 | auVar11) ^ auVar12;
        iVar44 = auVar53._0_4_;
        iVar70 = -(uint)(iVar44 < auVar56._0_4_);
        iVar50 = auVar53._4_4_;
        auVar57._4_4_ = -(uint)(iVar50 < auVar56._4_4_);
        iVar69 = auVar53._8_4_;
        iVar72 = -(uint)(iVar69 < auVar56._8_4_);
        iVar54 = auVar53._12_4_;
        auVar57._12_4_ = -(uint)(iVar54 < auVar56._12_4_);
        auVar65._4_4_ = iVar70;
        auVar65._0_4_ = iVar70;
        auVar65._8_4_ = iVar72;
        auVar65._12_4_ = iVar72;
        auVar73 = pshuflw(in_XMM11,auVar65,0xe8);
        auVar59._4_4_ = -(uint)(auVar56._4_4_ == iVar50);
        auVar59._12_4_ = -(uint)(auVar56._12_4_ == iVar54);
        auVar59._0_4_ = auVar59._4_4_;
        auVar59._8_4_ = auVar59._12_4_;
        auVar75 = pshuflw(in_XMM12,auVar59,0xe8);
        auVar57._0_4_ = auVar57._4_4_;
        auVar57._8_4_ = auVar57._12_4_;
        auVar56 = pshuflw(auVar73,auVar57,0xe8);
        auVar74._8_4_ = 0xffffffff;
        auVar74._0_8_ = 0xffffffffffffffff;
        auVar74._12_4_ = 0xffffffff;
        auVar74 = (auVar56 | auVar75 & auVar73) ^ auVar74;
        auVar56 = packssdw(auVar74,auVar74);
        if ((auVar56 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)(auStack_28380._0_8_ + uVar34 * 8) = 0x8000;
        }
        auVar57 = auVar59 & auVar65 | auVar57;
        auVar56 = packssdw(auVar57,auVar57);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar56 = packssdw(auVar56 ^ auVar3,auVar56 ^ auVar3);
        if ((auVar56._0_4_ >> 0x10 & 1) != 0) {
          *(undefined2 *)
           ((long)&(((File *)(auStack_28380._0_8_ + 8))->_file).
                   super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                   .
                   super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                   .
                   super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                   .super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                   super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                   super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
           + uVar34 * 8) = 0x8000;
        }
        auVar56 = (auVar64 | auVar10) ^ auVar12;
        iVar70 = -(uint)(iVar44 < auVar56._0_4_);
        auVar71._4_4_ = -(uint)(iVar50 < auVar56._4_4_);
        iVar72 = -(uint)(iVar69 < auVar56._8_4_);
        auVar71._12_4_ = -(uint)(iVar54 < auVar56._12_4_);
        auVar58._4_4_ = iVar70;
        auVar58._0_4_ = iVar70;
        auVar58._8_4_ = iVar72;
        auVar58._12_4_ = iVar72;
        auVar66._4_4_ = -(uint)(auVar56._4_4_ == iVar50);
        auVar66._12_4_ = -(uint)(auVar56._12_4_ == iVar54);
        auVar66._0_4_ = auVar66._4_4_;
        auVar66._8_4_ = auVar66._12_4_;
        auVar71._0_4_ = auVar71._4_4_;
        auVar71._8_4_ = auVar71._12_4_;
        auVar56 = auVar66 & auVar58 | auVar71;
        auVar56 = packssdw(auVar56,auVar56);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar56 = packssdw(auVar56 ^ auVar4,auVar56 ^ auVar4);
        if ((auVar56 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long *)(auStack_28380._0_8_ + 0x10) + uVar34) = 0x8000;
        }
        auVar74 = pshufhw(auVar58,auVar58,0x84);
        auVar57 = pshufhw(auVar66,auVar66,0x84);
        auVar59 = pshufhw(auVar74,auVar71,0x84);
        auVar60._8_4_ = 0xffffffff;
        auVar60._0_8_ = 0xffffffffffffffff;
        auVar60._12_4_ = 0xffffffff;
        auVar60 = (auVar59 | auVar57 & auVar74) ^ auVar60;
        auVar74 = packssdw(auVar60,auVar60);
        if ((auVar74 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long *)(auStack_28380._0_8_ + 0x18) + uVar34) = 0x8000;
        }
        auVar74 = (auVar64 | auVar9) ^ auVar12;
        iVar70 = -(uint)(iVar44 < auVar74._0_4_);
        auVar62._4_4_ = -(uint)(iVar50 < auVar74._4_4_);
        iVar72 = -(uint)(iVar69 < auVar74._8_4_);
        auVar62._12_4_ = -(uint)(iVar54 < auVar74._12_4_);
        auVar67._4_4_ = iVar70;
        auVar67._0_4_ = iVar70;
        auVar67._8_4_ = iVar72;
        auVar67._12_4_ = iVar72;
        auVar56 = pshuflw(auVar56,auVar67,0xe8);
        auVar61._4_4_ = -(uint)(auVar74._4_4_ == iVar50);
        auVar61._12_4_ = -(uint)(auVar74._12_4_ == iVar54);
        auVar61._0_4_ = auVar61._4_4_;
        auVar61._8_4_ = auVar61._12_4_;
        in_XMM12 = pshuflw(auVar75 & auVar73,auVar61,0xe8);
        in_XMM12 = in_XMM12 & auVar56;
        auVar62._0_4_ = auVar62._4_4_;
        auVar62._8_4_ = auVar62._12_4_;
        auVar56 = pshuflw(auVar56,auVar62,0xe8);
        auVar73._8_4_ = 0xffffffff;
        auVar73._0_8_ = 0xffffffffffffffff;
        auVar73._12_4_ = 0xffffffff;
        auVar73 = (auVar56 | in_XMM12) ^ auVar73;
        in_XMM11 = packssdw(auVar73,auVar73);
        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)((long *)(auStack_28380._0_8_ + 0x20) + uVar34) = 0x8000;
        }
        auVar62 = auVar61 & auVar67 | auVar62;
        auVar56 = packssdw(auVar62,auVar62);
        auVar75._8_4_ = 0xffffffff;
        auVar75._0_8_ = 0xffffffffffffffff;
        auVar75._12_4_ = 0xffffffff;
        auVar56 = packssdw(auVar56 ^ auVar75,auVar56 ^ auVar75);
        if ((auVar56 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long *)(auStack_28380._0_8_ + 0x28) + uVar34) = 0x8000;
        }
        auVar56 = (auVar64 | auVar8) ^ auVar12;
        iVar44 = -(uint)(iVar44 < auVar56._0_4_);
        auVar68._4_4_ = -(uint)(iVar50 < auVar56._4_4_);
        iVar69 = -(uint)(iVar69 < auVar56._8_4_);
        auVar68._12_4_ = -(uint)(iVar54 < auVar56._12_4_);
        auVar63._4_4_ = iVar44;
        auVar63._0_4_ = iVar44;
        auVar63._8_4_ = iVar69;
        auVar63._12_4_ = iVar69;
        auVar55._4_4_ = -(uint)(auVar56._4_4_ == iVar50);
        auVar55._12_4_ = -(uint)(auVar56._12_4_ == iVar54);
        auVar55._0_4_ = auVar55._4_4_;
        auVar55._8_4_ = auVar55._12_4_;
        auVar68._0_4_ = auVar68._4_4_;
        auVar68._8_4_ = auVar68._12_4_;
        auVar56 = auVar55 & auVar63 | auVar68;
        auVar56 = packssdw(auVar56,auVar56);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar56 = packssdw(auVar56 ^ auVar5,auVar56 ^ auVar5);
        if ((auVar56 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long *)(auStack_28380._0_8_ + 0x30) + uVar34) = 0x8000;
        }
        auVar74 = pshufhw(auVar63,auVar63,0x84);
        auVar56 = pshufhw(auVar55,auVar55,0x84);
        auVar64 = pshufhw(auVar74,auVar68,0x84);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar56 = packssdw(auVar56 & auVar74,(auVar64 | auVar56 & auVar74) ^ auVar6);
        if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long *)(auStack_28380._0_8_ + 0x38) + uVar34) = 0x8000;
        }
        uVar34 = uVar34 + 8;
      } while (((uVar32 >> 3) + 8 & 0xfffffffffffffff8) != uVar34);
    }
    if (avStack_28478[0].
        super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        avStack_28478[0].
        super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar32 = 0;
      do {
        pPVar37 = (Palette *)
                  (*(long *)((long)avStack_28478[0].
                                   super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar32 * 8) * 8 +
                  auStack_28380._0_8_);
        pPVar51 = vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar32;
        pvVar24 = ProtoPalette::begin(pPVar51);
        pvVar25 = ProtoPalette::end(pPVar51);
        for (; pvVar24 != pvVar25; pvVar24 = pvVar24 + 1) {
          Palette::addColor(pPVar37,*pvVar24);
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 < (ulong)((long)avStack_28478[0].
                                      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)avStack_28478[0].
                                      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (PStack_28180.embeddedPal == (png_color *)0x0) {
      bVar15 = Png::isSuitableForGrayscale(&PStack_28180);
      if (bVar15) {
        sorting::grayscale((vector<Palette,_std::allocator<Palette>_> *)auStack_28380,
                           &PStack_28180.colors._colors);
      }
      else {
        sorting::rgb((vector<Palette,_std::allocator<Palette>_> *)auStack_28380);
      }
    }
    else {
      sorting::indexed((vector<Palette,_std::allocator<Palette>_> *)auStack_28380,
                       PStack_28180.nbColors,PStack_28180.embeddedPal,PStack_28180.transparencyPal);
    }
    std::
    _Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
    ::
    _Tuple_impl<std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>&,std::vector<Palette,std::allocator<Palette>>&,void>
              ((_Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
                *)&tStack_284b0,
               (vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)(auStack_28480 + 8),(vector<Palette,_std::allocator<Palette>_> *)auStack_28380);
    if ((pointer)auStack_28380._0_8_ != (pointer)0x0) {
      operator_delete((void *)auStack_28380._0_8_,
                      aaStack_28370[0]._M_allocated_capacity - auStack_28380._0_8_);
    }
    if ((Png *)avStack_28478[0].
               super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start != (Png *)0x0) {
      operator_delete(avStack_28478[0].
                      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)avStack_28478[0].
                            super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)avStack_28478[0].
                            super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    makePalsAsSpecified(&tStack_284b0,&vStack_28508);
  }
  outputPalettes((vector<Palette,_std::allocator<Palette>_> *)&tStack_284b0);
  if (options.allowDedup == false) {
    if ((uint)options.maxNbTiles._M_elems[1] + (uint)options.maxNbTiles._M_elems[0] <
        (PStack_28180.width >> 3) * (PStack_28180.height >> 3)) {
      fatal("Image contains %u tiles, exceeding the limit of %u + %u");
    }
    if (options.output.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
        .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
      Options::verbosePrint(&options,'\x02',"Generating unoptimized tile data...\n");
      auStack_28480._0_2_ = 0;
      auStack_28480._2_2_ = 0;
      auStack_28480._4_2_ = 0;
      auStack_28480._6_2_ = 0;
      _Stack_28390 = '\0';
      iVar44 = File::open((File *)auStack_28480,(char *)&options.output,0x14);
      if (CONCAT44(extraout_var,iVar44) == 0) {
        _Stack_28280._M_first._M_storage =
             (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
             &options.output;
        std::
        visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
                  ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                    *)auStack_28380,
                   (Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
                    *)&_Stack_28280._M_first,
                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                    *)auStack_28480);
        uVar22 = auStack_28380._0_8_;
        piVar27 = __errno_location();
        pcVar43 = strerror(*piVar27);
        fatal("Failed to open \"%s\": %s",uVar22,pcVar43);
      }
      uVar30 = PStack_28180.width >> 3;
      if (options.inputSlice.width != 0) {
        uVar30 = (uint)options.inputSlice.width;
      }
      uVar33 = PStack_28180.height >> 3;
      if (options.inputSlice.height != 0) {
        uVar33 = (uint)options.inputSlice.height;
      }
      uVar32 = (ulong)(uVar33 & 0xffff) * (ulong)(uVar30 & 0xffff);
      lStack_284c0 = uVar32 - options.trim;
      if (options.trim <= uVar32 && lStack_284c0 != 0) {
        uVar30 = (uint)options.inputSlice.width * 8;
        if (options.inputSlice.width == 0) {
          uVar30 = PStack_28180.width;
        }
        uVar33 = (uint)options.inputSlice.height * 8;
        if (options.inputSlice.height == 0) {
          uVar33 = PStack_28180.height;
        }
        uStack_284b8 = CONCAT71(uStack_284b8._1_7_,options.columnMajor);
        uVar42 = uVar33;
        if (options.columnMajor != false) {
          uVar42 = 0;
        }
        uVar19 = 0;
        if (options.columnMajor != false) {
          uVar19 = uVar30;
        }
        if (uVar19 != 0 || uVar42 != 0) {
          _Stack_28528._M_p = (pointer)auStack_284e8._0_8_;
          uVar21 = 0;
          uVar38 = 0;
          do {
            aVar14 = aaStack_28370[0];
            aaStack_28370[0]._M_allocated_capacity._4_4_ = options.inputSlice.top + uVar38;
            aaStack_28370[0]._M_allocated_capacity._0_4_ = options.inputSlice.left + uVar21;
            auStack_28380._0_8_ = _Stack_28528._M_p;
            auStack_28380._8_8_ = &PStack_28180;
            aaStack_28370[0]._8_8_ = aVar14._8_8_;
            if (*(long *)_Stack_28528._M_p == -1) {
              uVar39 = 0;
            }
            else {
              uVar39 = tStack_284b0.
                       super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                       ._M_head_impl.
                       super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[*(long *)_Stack_28528._M_p];
            }
            pPVar37 = tStack_284b0.
                      super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                      .super__Tuple_impl<1UL,_std::vector<Palette,_std::allocator<Palette>_>_>.
                      super__Head_base<1UL,_std::vector<Palette,_std::allocator<Palette>_>,_false>.
                      _M_head_impl.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar39;
            y_00 = 0;
            do {
              uVar16 = TileData::rowBitplanes((Tile *)(auStack_28380 + 8),pPVar37,y_00);
              pbVar26 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                        *)&_Stack_28280._M_first,
                                       (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                        *)auStack_28480);
              if (*(undefined1 **)(pbVar26 + 0x28) < *(undefined1 **)(pbVar26 + 0x30)) {
                **(undefined1 **)(pbVar26 + 0x28) = (char)uVar16;
                *(long *)(pbVar26 + 0x28) = *(long *)(pbVar26 + 0x28) + 1;
              }
              else {
                (**(code **)(*(long *)pbVar26 + 0x68))(pbVar26,(char)uVar16);
              }
              if (options.bitDepth == '\x02') {
                pbVar26 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                          *)&_Stack_28280._M_first,
                                         (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                          *)auStack_28480);
                if (*(undefined1 **)(pbVar26 + 0x28) < *(undefined1 **)(pbVar26 + 0x30)) {
                  **(undefined1 **)(pbVar26 + 0x28) = (char)(uVar16 >> 8);
                  *(long *)(pbVar26 + 0x28) = *(long *)(pbVar26 + 0x28) + 1;
                }
                else {
                  (**(code **)(*(long *)pbVar26 + 0x68))(pbVar26,uVar16 >> 8);
                }
              }
              y_00 = y_00 + 1;
            } while (y_00 != 8);
            lStack_284c0 = lStack_284c0 + -1;
            if (lStack_284c0 == 0) goto LAB_0010f477;
            uVar20 = uVar21;
            if ((char)uStack_284b8 != '\0') {
              uVar20 = uVar38;
            }
            uVar20 = uVar20 + 8;
            if ((char)uStack_284b8 == '\0') {
              uVar21 = uVar20;
              if (uVar20 == uVar30) {
                uVar21 = 0;
                uVar38 = uVar38 + 8;
              }
            }
            else {
              uVar38 = uVar20;
              if (uVar20 == uVar33) {
                uVar21 = uVar21 + 8;
                uVar38 = 0;
              }
            }
            _Stack_28528._M_p = _Stack_28528._M_p + 0x10;
          } while ((uVar21 != uVar19) || (uVar38 != uVar42));
LAB_0010ef0f:
          __assert_fail("remainingTiles == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                        ,0x326,"outputTileData");
        }
        if (lStack_284c0 != 0) goto LAB_0010ef0f;
      }
LAB_0010f477:
      File::~File((File *)auStack_28480);
    }
    if (((options.tilemap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
          _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
          super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false) ||
        (options.attrmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
         _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
         super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false)) ||
       (options.palmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
        .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true)) {
      Options::verbosePrint
                (&options,'\x02',"Generating unoptimized tilemap and/or attrmap and/or palmap...\n")
      ;
      cStack_28388 = '\0';
      cStack_28288 = '\0';
      cStack_28188 = '\0';
      unoptimized::outputMaps::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&options.tilemap,
                 (optional<std::filesystem::__cxx11::path> *)auStack_28480,file);
      unoptimized::outputMaps::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&options.attrmap,
                 (optional<std::filesystem::__cxx11::path> *)auStack_28380,file_00);
      unoptimized::outputMaps::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&options.palmap,
                 (optional<std::filesystem::__cxx11::path> *)&_Stack_28280._M_first,file_01);
      uVar22 = auStack_284e8._8_8_;
      if (auStack_284e8._0_8_ != auStack_284e8._8_8_) {
        bVar46 = 0;
        bVar45 = 0;
        pAVar41 = (pointer)auStack_284e8._0_8_;
        do {
          sVar2 = pAVar41->protoPaletteID;
          if (options.maxNbTiles._M_elems[bVar46] == (ushort)bVar45) {
            if (bVar46 != 0) {
              __assert_fail("bank == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                            ,0x33d,"outputMaps");
            }
            bVar46 = 1;
            bVar45 = 0;
          }
          if (cStack_28388 == '\x01') {
            pbVar26 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                      *)&VStack_284c8,
                                     (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                      *)auStack_28480);
            cVar29 = options.baseTileIDs._M_elems[bVar46] + bVar45;
            if (*(char **)(pbVar26 + 0x28) < *(char **)(pbVar26 + 0x30)) {
              **(char **)(pbVar26 + 0x28) = cVar29;
              *(long *)(pbVar26 + 0x28) = *(long *)(pbVar26 + 0x28) + 1;
            }
            else {
              (**(code **)(*(long *)pbVar26 + 0x68))(pbVar26,cVar29);
            }
          }
          if (cStack_28288 == '\x01') {
            if (sVar2 == 0xffffffffffffffff) {
              bVar47 = 0;
            }
            else {
              bVar47 = (byte)tStack_284b0.
                             super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                             ._M_head_impl.
                             super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[sVar2] & 7;
            }
            pbVar26 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                      *)&VStack_284c8,
                                     (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                      *)auStack_28380);
            bVar47 = bVar47 | bVar46 * '\b';
            if (*(byte **)(pbVar26 + 0x28) < *(byte **)(pbVar26 + 0x30)) {
              **(byte **)(pbVar26 + 0x28) = bVar47;
              *(long *)(pbVar26 + 0x28) = *(long *)(pbVar26 + 0x28) + 1;
            }
            else {
              (**(code **)(*(long *)pbVar26 + 0x68))(pbVar26,bVar47);
            }
          }
          if (cStack_28188 == '\x01') {
            pbVar26 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                      *)&VStack_284c8,
                                     (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                      *)&_Stack_28280._M_first);
            if (sVar2 == 0xffffffffffffffff) {
              uVar28 = 0;
            }
            else {
              uVar28 = (undefined1)
                       tStack_284b0.
                       super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                       ._M_head_impl.
                       super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[sVar2];
            }
            if (*(undefined1 **)(pbVar26 + 0x28) < *(undefined1 **)(pbVar26 + 0x30)) {
              **(undefined1 **)(pbVar26 + 0x28) = uVar28;
              *(long *)(pbVar26 + 0x28) = *(long *)(pbVar26 + 0x28) + 1;
            }
            else {
              (**(code **)(*(long *)pbVar26 + 0x68))(pbVar26,uVar28);
            }
          }
          bVar45 = bVar45 + 1;
          pAVar41 = pAVar41 + 1;
        } while (pAVar41 != (pointer)uVar22);
      }
      if (cStack_28188 == '\x01') {
        cStack_28188 = '\0';
        File::~File((File *)&_Stack_28280._M_first);
      }
      if (cStack_28288 == '\x01') {
        cStack_28288 = '\0';
        File::~File((File *)auStack_28380);
      }
      if (cStack_28388 == '\x01') {
        cStack_28388 = '\0';
        File::~File((File *)auStack_28480);
      }
    }
  }
  else {
    Options::verbosePrint(&options,'\x02',"Deduplicating tiles...\n");
    bVar15 = options.columnMajor;
    auStack_28380._0_8_ = auStack_28350;
    auStack_28380._8_8_ = (Png *)0x1;
    aaStack_28370[0] =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )0x0;
    aaStack_28370[1]._0_4_ = 1.0;
    stack0xfffffffffffd7ca8 = (undefined1  [16])0x0;
    auStack_28350._8_16_ = (undefined1  [16])0x0;
    auStack_28350._24_8_ = 0;
    if (options.inputSlice.width != 0) {
      PStack_28180.width = (uint)options.inputSlice.width << 3;
    }
    if (options.inputSlice.height != 0) {
      PStack_28180.height = (uint)options.inputSlice.height << 3;
    }
    uVar30 = PStack_28180.height;
    if (options.columnMajor != false) {
      uVar30 = 0;
    }
    uVar33 = 0;
    if (options.columnMajor != false) {
      uVar33 = PStack_28180.width;
    }
    if (uVar33 != 0 || uVar30 != 0) {
      uVar42 = 0;
      uVar19 = 0;
      aVar48._M_elems = (_Type)auStack_284e8._0_8_;
      do {
        avStack_28478[0].
        super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(options.inputSlice.top + uVar19,options.inputSlice.left + uVar42);
        avStack_28478[0].
        super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&PStack_28180;
        auStack_28480 = (undefined1  [8])aVar48._M_elems;
        optimized::UniqueTiles::addTile
                  ((UniqueTiles *)&_Stack_28280._M_first,(Tile *)auStack_28380,
                   (Palette *)(auStack_28480 + 8));
        *(bool *)((long)aVar48._M_elems + 0xb) = _Stack_28280._0_4_ == 2 || _Stack_28280._0_4_ == 4;
        *(bool *)((long)aVar48._M_elems + 10) = _Stack_28280._0_4_ == 3 || _Stack_28280._0_4_ == 4;
        uVar17 = options.maxNbTiles._M_elems[0];
        bVar52 = options.maxNbTiles._M_elems[0] <= (ushort)_Stack_28280._4_2_;
        *(bool *)((long)aVar48._M_elems + 9) = bVar52;
        if (!bVar52) {
          uVar17 = 0;
        }
        uVar21 = uVar42;
        if (bVar15 != false) {
          uVar21 = uVar19;
        }
        uVar21 = uVar21 + 8;
        *(uchar *)((long)aVar48._M_elems + 8) =
             (_Stack_28280._4_1_ - (char)uVar17) + options.baseTileIDs._M_elems[bVar52];
        if (bVar15 == false) {
          uVar42 = uVar21;
          if (uVar21 == PStack_28180.width) {
            uVar42 = 0;
            uVar19 = uVar19 + 8;
          }
        }
        else {
          uVar19 = uVar21;
          if (uVar21 == PStack_28180.height) {
            uVar42 = uVar42 + 8;
            uVar19 = 0;
          }
        }
        aVar48._M_elems = aVar48._M_elems + 0x10;
      } while ((uVar42 != uVar33) || (uVar19 != uVar30));
      if ((ulong)options.maxNbTiles._M_elems[1] + (ulong)options.maxNbTiles._M_elems[0] <
          (ulong)((long)(auStack_28350._16_8_ - auStack_28350._8_8_) >> 3)) {
        fatal("Image contains %zu tiles, exceeding the limit of %u + %u");
      }
    }
    if (options.output.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
        .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
      Options::verbosePrint(&options,'\x02',"Generating optimized tile data...\n");
      auStack_28480._0_2_ = 0;
      auStack_28480._2_2_ = 0;
      auStack_28480._4_2_ = 0;
      auStack_28480._6_2_ = 0;
      _Stack_28390 = '\0';
      iVar44 = File::open((File *)auStack_28480,(char *)&options.output,0x14);
      if (CONCAT44(extraout_var_00,iVar44) == 0) {
        VStack_284c8.super_anon_class_8_1_89901123.path = (anon_class_8_1_89901123)&options.output;
        std::
        visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
                  ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                    *)&_Stack_28280._M_first,&VStack_284c8,
                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                    *)auStack_28480);
        piVar27 = __errno_location();
        pcVar43 = strerror(*piVar27);
        fatal("Failed to create \"%s\": %s",_Stack_28280._M_first._M_storage,pcVar43);
      }
      plVar40 = (long *)(auStack_28350._16_8_ + options.trim * -8);
      if ((long *)auStack_28350._8_8_ != plVar40) {
        sVar35 = 0;
        plVar49 = (long *)auStack_28350._8_8_;
        do {
          lVar31 = *plVar49;
          if (sVar35 != *(short *)(lVar31 + 0x12)) {
            __assert_fail("tile->tileID == tileID",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                          ,0x39e,"outputTileData");
          }
          pbVar26 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                    *)&_Stack_28280._M_first,
                                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                    *)auStack_28480);
          (**(code **)(*(long *)pbVar26 + 0x60))(pbVar26,lVar31,(ulong)options.bitDepth << 3);
          plVar49 = plVar49 + 1;
          sVar35 = sVar35 + 1;
        } while (plVar49 != plVar40);
      }
      File::~File((File *)auStack_28480);
    }
    if (options.tilemap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
        _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
      Options::verbosePrint(&options,'\x02',"Generating optimized tilemap...\n");
      auStack_28480._0_2_ = 0;
      auStack_28480._2_2_ = 0;
      auStack_28480._4_2_ = 0;
      auStack_28480._6_2_ = 0;
      _Stack_28390 = '\0';
      iVar44 = File::open((File *)auStack_28480,(char *)&options.tilemap,0x14);
      if (CONCAT44(extraout_var_01,iVar44) == 0) {
        VStack_284c8.super_anon_class_8_1_89901123.path = (anon_class_8_1_89901123)&options.tilemap;
        std::
        visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
                  ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                    *)&_Stack_28280._M_first,&VStack_284c8,
                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                    *)auStack_28480);
        piVar27 = __errno_location();
        pcVar43 = strerror(*piVar27);
        fatal("Failed to create \"%s\": %s",_Stack_28280._M_first._M_storage,pcVar43);
      }
      uVar22 = auStack_284e8._8_8_;
      if (auStack_284e8._0_8_ != auStack_284e8._8_8_) {
        pAVar41 = (pointer)auStack_284e8._0_8_;
        do {
          pbVar26 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                    *)&_Stack_28280._M_first,
                                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                    *)auStack_28480);
          if (*(uint8_t **)(pbVar26 + 0x28) < *(uint8_t **)(pbVar26 + 0x30)) {
            **(uint8_t **)(pbVar26 + 0x28) = pAVar41->tileID;
            *(long *)(pbVar26 + 0x28) = *(long *)(pbVar26 + 0x28) + 1;
          }
          else {
            (**(code **)(*(long *)pbVar26 + 0x68))(pbVar26,pAVar41->tileID);
          }
          pAVar41 = pAVar41 + 1;
        } while (pAVar41 != (pointer)uVar22);
      }
      File::~File((File *)auStack_28480);
    }
    if (options.attrmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
        _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
      Options::verbosePrint(&options,'\x02',"Generating optimized attrmap...\n");
      auStack_28480._0_2_ = 0;
      auStack_28480._2_2_ = 0;
      auStack_28480._4_2_ = 0;
      auStack_28480._6_2_ = 0;
      _Stack_28390 = '\0';
      iVar44 = File::open((File *)auStack_28480,(char *)&options.attrmap,0x14);
      if (CONCAT44(extraout_var_02,iVar44) == 0) {
        VStack_284c8.super_anon_class_8_1_89901123.path = (anon_class_8_1_89901123)&options.attrmap;
        std::
        visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
                  ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                    *)&_Stack_28280._M_first,&VStack_284c8,
                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                    *)auStack_28480);
        piVar27 = __errno_location();
        pcVar43 = strerror(*piVar27);
        fatal("Failed to create \"%s\": %s",_Stack_28280._M_first._M_storage,pcVar43);
      }
      uVar22 = auStack_284e8._8_8_;
      for (pAVar41 = (pointer)auStack_284e8._0_8_; pAVar41 != (pointer)uVar22; pAVar41 = pAVar41 + 1
          ) {
        if (pAVar41->protoPaletteID == 0xffffffffffffffff) {
          bVar46 = 0;
        }
        else {
          bVar46 = (byte)tStack_284b0.
                         super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                         ._M_head_impl.
                         super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[pAVar41->protoPaletteID] & 7;
        }
        bVar15 = pAVar41->xFlip;
        bVar52 = pAVar41->yFlip;
        bVar1 = pAVar41->bank;
        pbVar26 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                  *)&_Stack_28280._M_first,
                                 (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                  *)auStack_28480);
        bVar46 = bVar1 << 3 | bVar52 << 6 | bVar15 << 5 | bVar46;
        if (*(byte **)(pbVar26 + 0x28) < *(byte **)(pbVar26 + 0x30)) {
          **(byte **)(pbVar26 + 0x28) = bVar46;
          *(long *)(pbVar26 + 0x28) = *(long *)(pbVar26 + 0x28) + 1;
        }
        else {
          (**(code **)(*(long *)pbVar26 + 0x68))(pbVar26,bVar46);
        }
      }
      File::~File((File *)auStack_28480);
    }
    if (options.palmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
        .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
      Options::verbosePrint(&options,'\x02',"Generating optimized palmap...\n");
      auStack_28480._0_2_ = 0;
      auStack_28480._2_2_ = 0;
      auStack_28480._4_2_ = 0;
      auStack_28480._6_2_ = 0;
      _Stack_28390 = '\0';
      iVar44 = File::open((File *)auStack_28480,(char *)&options.palmap,0x14);
      if (CONCAT44(extraout_var_03,iVar44) == 0) {
        VStack_284c8.super_anon_class_8_1_89901123.path = (anon_class_8_1_89901123)&options.palmap;
        std::
        visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
                  ((__visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
                    *)&_Stack_28280._M_first,&VStack_284c8,
                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                    *)auStack_28480);
        piVar27 = __errno_location();
        pcVar43 = strerror(*piVar27);
        fatal("Failed to create \"%s\": %s",_Stack_28280._M_first._M_storage,pcVar43);
      }
      uVar22 = auStack_284e8._8_8_;
      if (auStack_284e8._0_8_ != auStack_284e8._8_8_) {
        pAVar41 = (pointer)auStack_284e8._0_8_;
        do {
          pbVar26 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                    *)&_Stack_28280._M_first,
                                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                    *)auStack_28480);
          if (pAVar41->protoPaletteID == 0xffffffffffffffff) {
            uVar28 = 0;
          }
          else {
            uVar28 = (undefined1)
                     tStack_284b0.
                     super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                     ._M_head_impl.
                     super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[pAVar41->protoPaletteID];
          }
          if (*(undefined1 **)(pbVar26 + 0x28) < *(undefined1 **)(pbVar26 + 0x30)) {
            **(undefined1 **)(pbVar26 + 0x28) = uVar28;
            *(long *)(pbVar26 + 0x28) = *(long *)(pbVar26 + 0x28) + 1;
          }
          else {
            (**(code **)(*(long *)pbVar26 + 0x68))(pbVar26,uVar28);
          }
          pAVar41 = pAVar41 + 1;
        } while (pAVar41 != (pointer)uVar22);
      }
      File::~File((File *)auStack_28480);
    }
    if ((void *)auStack_28350._8_8_ != (void *)0x0) {
      operator_delete((void *)auStack_28350._8_8_,auStack_28350._24_8_ - auStack_28350._8_8_);
    }
    std::
    _Hashtable<TileData,_TileData,_std::allocator<TileData>,_std::__detail::_Identity,_std::equal_to<TileData>,_std::hash<TileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<TileData,_TileData,_std::allocator<TileData>,_std::__detail::_Identity,_std::equal_to<TileData>,_std::hash<TileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)auStack_28380);
  }
  if (tStack_284b0.
      super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
      .
      super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
      ._M_head_impl.
      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tStack_284b0.
                    super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                    .
                    super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                    ._M_head_impl.
                    super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)tStack_284b0.
                          super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                          .
                          super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tStack_284b0.
                          super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                          .
                          super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (tStack_284b0.
      super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
      .super__Tuple_impl<1UL,_std::vector<Palette,_std::allocator<Palette>_>_>.
      super__Head_base<1UL,_std::vector<Palette,_std::allocator<Palette>_>,_false>._M_head_impl.
      super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(tStack_284b0.
                    super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                    .super__Tuple_impl<1UL,_std::vector<Palette,_std::allocator<Palette>_>_>.
                    super__Head_base<1UL,_std::vector<Palette,_std::allocator<Palette>_>,_false>.
                    _M_head_impl.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)tStack_284b0.
                          super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                          .super__Tuple_impl<1UL,_std::vector<Palette,_std::allocator<Palette>_>_>.
                          super__Head_base<1UL,_std::vector<Palette,_std::allocator<Palette>_>,_false>
                          ._M_head_impl.super__Vector_base<Palette,_std::allocator<Palette>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tStack_284b0.
                          super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                          .super__Tuple_impl<1UL,_std::vector<Palette,_std::allocator<Palette>_>_>.
                          super__Head_base<1UL,_std::vector<Palette,_std::allocator<Palette>_>,_false>
                          ._M_head_impl.super__Vector_base<Palette,_std::allocator<Palette>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)auStack_284e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)auStack_284e8._0_8_,(long)pAStack_284d8 - auStack_284e8._0_8_);
  }
  if (vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
      super__Vector_impl_data._M_start != (ProtoPalette *)0x0) {
    operator_delete(vStack_28508.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_28508.
                          super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_28508.
                          super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Png::~Png(&PStack_28180);
  return;
}

Assistant:

void process() {
	options.verbosePrint(Options::VERB_CFG, "Using libpng %s\n", png_get_libpng_ver(nullptr));

	options.verbosePrint(Options::VERB_LOG_ACT, "Reading tiles...\n");
	Png png(*options.input); // This also sets `hasTransparentPixels` as a side effect
	ImagePalette const &colors = png.getColors();

	// Now, we have all the image's colors in `colors`
	// The next step is to order the palette

	if (options.verbosity >= Options::VERB_INTERM) {
		fputs("Image colors: [ ", stderr);
		for (auto const &slot : colors) {
			if (!slot.has_value()) {
				continue;
			}
			fprintf(stderr, "#%08x, ", slot->toCSS());
		}
		fputs("]\n", stderr);
	}

	// Now, iterate through the tiles, generating proto-palettes as we go
	// We do this unconditionally because this performs the image validation (which we want to
	// perform even if no output is requested), and because it's necessary to generate any
	// output (with the exception of an un-duplicated tilemap, but that's an acceptable loss.)
	std::vector<ProtoPalette> protoPalettes;
	DefaultInitVec<AttrmapEntry> attrmap{};

	for (auto tile : png.visitAsTiles()) {
		ProtoPalette tileColors;
		AttrmapEntry &attrs = attrmap.emplace_back();
		uint8_t nbColorsInTile = 0;

		for (uint32_t y = 0; y < 8; ++y) {
			for (uint32_t x = 0; x < 8; ++x) {
				Rgba color = tile.pixel(x, y);
				if (!color.isTransparent()) { // Do not count transparency in for packing
					// Add the color to the proto-pal (if not full), and count it if it was unique.
					if (tileColors.add(color.cgbColor())) {
						++nbColorsInTile;
					}
				}
			}
		}

		if (tileColors.empty()) {
			// "Empty" proto-palettes screw with the packing process, so discard those
			attrs.protoPaletteID = AttrmapEntry::transparent;
			continue;
		}

		// Insert the proto-palette, making sure to avoid overlaps
		for (size_t n = 0; n < protoPalettes.size(); ++n) {
			switch (tileColors.compare(protoPalettes[n])) {
			case ProtoPalette::WE_BIGGER:
				protoPalettes[n] = tileColors; // Override them
				// Remove any other proto-palettes that we encompass
				// (Example [(0, 1), (0, 2)], inserting (0, 1, 2))
				/*
				 * The following code does its job, except that references to the removed
				 * proto-palettes are not updated, causing issues.
				 * TODO: overlap might not be detrimental to the packing algorithm.
				 * Investigation is necessary, especially if pathological cases are found.
				 *
				 * for (size_t i = protoPalettes.size(); --i != n;) {
				 *     if (tileColors.compare(protoPalettes[i]) == ProtoPalette::WE_BIGGER) {
				 *         protoPalettes.erase(protoPalettes.begin() + i);
				 *     }
				 * }
				 */
				[[fallthrough]];

			case ProtoPalette::THEY_BIGGER:
				// Do nothing, they already contain us
				attrs.protoPaletteID = n;
				goto contained;

			case ProtoPalette::NEITHER:
				break; // Keep going
			}
		}

		if (nbColorsInTile > options.maxOpaqueColors()) {
			fatal("Tile at (%" PRIu32 ", %" PRIu32 ") has %zu opaque colors, more than %" PRIu8 "!",
			      tile.x, tile.y, nbColorsInTile, options.maxOpaqueColors());
		}

		attrs.protoPaletteID = protoPalettes.size();
		if (protoPalettes.size() == AttrmapEntry::transparent) { // Check for overflow
			fatal("Reached %zu proto-palettes... sorry, this image is too much for me to handle :(",
			      AttrmapEntry::transparent);
		}
		protoPalettes.push_back(tileColors);
contained:;
	}

	options.verbosePrint(Options::VERB_INTERM, "Image contains %zu proto-palette%s\n",
	                     protoPalettes.size(), protoPalettes.size() != 1 ? "s" : "");
	if (options.verbosity >= Options::VERB_INTERM) {
		for (auto const &protoPal : protoPalettes) {
			fputs("[ ", stderr);
			for (uint16_t color : protoPal) {
				fprintf(stderr, "$%04x, ", color);
			}
			fputs("]\n", stderr);
		}
	}

	if (options.palSpecType == Options::EMBEDDED) {
		generatePalSpec(png);
	}
	auto [mappings, palettes] = options.palSpecType == Options::NO_SPEC
	                                ? generatePalettes(protoPalettes, png)
	                                : makePalsAsSpecified(protoPalettes);
	outputPalettes(palettes);

	// If deduplication is not happening, we just need to output the tile data and/or maps as-is
	if (!options.allowDedup) {
		uint32_t const nbTilesH = png.getHeight() / 8, nbTilesW = png.getWidth() / 8;

		// Check the tile count
		if (nbTilesW * nbTilesH > options.maxNbTiles[0] + options.maxNbTiles[1]) {
			fatal("Image contains %" PRIu32 " tiles, exceeding the limit of %" PRIu16 " + %" PRIu16,
			      nbTilesW * nbTilesH, options.maxNbTiles[0], options.maxNbTiles[1]);
		}

		if (options.output.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating unoptimized tile data...\n");
			unoptimized::outputTileData(png, attrmap, palettes, mappings);
		}

		if (options.tilemap.has_value() || options.attrmap.has_value()
		    || options.palmap.has_value()) {
			options.verbosePrint(
			    Options::VERB_LOG_ACT,
			    "Generating unoptimized tilemap and/or attrmap and/or palmap...\n");
			unoptimized::outputMaps(attrmap, mappings);
		}
	} else {
		// All of these require the deduplication process to be performed to be output
		options.verbosePrint(Options::VERB_LOG_ACT, "Deduplicating tiles...\n");
		optimized::UniqueTiles tiles = optimized::dedupTiles(png, attrmap, palettes, mappings);

		if (tiles.size() > options.maxNbTiles[0] + options.maxNbTiles[1]) {
			fatal("Image contains %zu tiles, exceeding the limit of %" PRIu16 " + %" PRIu16,
			      tiles.size(), options.maxNbTiles[0], options.maxNbTiles[1]);
		}

		if (options.output.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating optimized tile data...\n");
			optimized::outputTileData(tiles);
		}

		if (options.tilemap.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating optimized tilemap...\n");
			optimized::outputTilemap(attrmap);
		}

		if (options.attrmap.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating optimized attrmap...\n");
			optimized::outputAttrmap(attrmap, mappings);
		}

		if (options.palmap.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating optimized palmap...\n");
			optimized::outputPalmap(attrmap, mappings);
		}
	}
}